

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

L2NormalizeLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::mutable_l2normalize(NeuralNetworkLayer *this)

{
  L2NormalizeLayerParams *this_00;
  
  if (this->_oneof_case_[0] != 0xaa) {
    clear_layer(this);
    this->_oneof_case_[0] = 0xaa;
    this_00 = (L2NormalizeLayerParams *)operator_new(0x18);
    L2NormalizeLayerParams::L2NormalizeLayerParams(this_00);
    (this->layer_).l2normalize_ = this_00;
  }
  return (L2NormalizeLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::L2NormalizeLayerParams* NeuralNetworkLayer::mutable_l2normalize() {
  if (!has_l2normalize()) {
    clear_layer();
    set_has_l2normalize();
    layer_.l2normalize_ = new ::CoreML::Specification::L2NormalizeLayerParams;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NeuralNetworkLayer.l2normalize)
  return layer_.l2normalize_;
}